

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

void announce_login(CHAR_DATA *ch)

{
  bool bVar1;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  char *rstring;
  CHAR_DATA *guardian;
  undefined1 in_stack_000000f0 [16];
  undefined1 in_stack_00000100 [16];
  char *in_stack_000010a8;
  char *in_stack_00001178;
  CHAR_DATA *in_stack_00001180;
  CHAR_DATA *in_stack_fffffffffffffe88;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  char *local_130;
  char **in_stack_fffffffffffffed8;
  char **in_stack_fffffffffffffee0;
  string local_100 [32];
  char *local_e0;
  CHAR_DATA *local_d8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c8 [3];
  undefined8 local_b0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_a8;
  char *local_a0;
  size_t local_98;
  string *local_90;
  char *local_88 [2];
  undefined1 *local_78;
  char *local_70;
  char **local_68;
  char *local_60;
  char **local_58;
  undefined8 *local_50;
  char *local_48;
  size_t sStack_40;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_38;
  undefined8 *local_30;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_28;
  undefined8 local_20;
  undefined8 *local_18;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_10;
  char *local_8;
  
  if ((((*(short *)(in_RDI + 0x132) != 0) && (*(short *)(in_RDI + 0x132) < 8)) &&
      (bVar1 = is_immortal(in_stack_fffffffffffffe88), !bVar1)) &&
     (local_d8 = get_cabal_guardian((int)((ulong)in_stack_fffffffffffffe88 >> 0x20)),
     local_d8 != (CHAR_DATA *)0x0)) {
    local_e0 = talloc_string(in_stack_000010a8);
    fmt::v9::sprintf<char*,char*,char>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    local_68 = &local_130;
    local_70 = "\x1b[1;37m{}\x1b[0;37m";
    local_60 = "\x1b[1;37m{}\x1b[0;37m";
    local_130 = "\x1b[1;37m{}\x1b[0;37m";
    local_58 = local_68;
    local_98 = std::char_traits<char>::length((char_type *)0x5b11cd);
    local_8 = local_70;
    local_78 = &stack0xfffffffffffffee0;
    local_88[0] = local_130;
    local_90 = local_100;
    local_50 = local_88;
    local_a0 = local_130;
    local_48 = local_a0;
    sStack_40 = local_98;
    local_c8[0] = fmt::v9::
                  make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::__cxx11::string&>
                            (in_stack_fffffffffffffe98);
    local_30 = &local_b0;
    local_38 = local_c8;
    local_20 = 0xd;
    local_b0 = 0xd;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    local_a8 = local_38;
    fmt::v9::vformat_abi_cxx11_((string_view)in_stack_00000100,(format_args)in_stack_000000f0);
    this = (string *)&stack0xfffffffffffffee0;
    std::__cxx11::string::operator=(local_100,this);
    std::__cxx11::string::~string(this);
    std::__cxx11::string::data();
    do_cb(in_stack_00001180,in_stack_00001178);
    std::__cxx11::string::~string(local_100);
  }
  return;
}

Assistant:

void announce_login(CHAR_DATA *ch)
{
	CHAR_DATA *guardian;
	char *rstring;

	if (ch->cabal == 0 || ch->cabal > MAX_CABAL || is_immortal(ch))
		return;

	guardian = get_cabal_guardian(ch->cabal);

	if (!guardian)
		return;

	rstring = talloc_string(cabal_messages[ch->cabal].login);

	auto buffer = fmt::sprintf(rstring, ch->name);
	buffer = fmt::format("\x01B[1;37m{}\x01B[0;37m", buffer);
	do_cb(guardian, buffer.data());
}